

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O3

EPSG * EPSG_new(UINT32 c,UINT32 r)

{
  uint32_t uVar1;
  EPSG *psg;
  long lVar2;
  uint8_t *puVar3;
  
  psg = (EPSG *)calloc(1,0xc0);
  if (psg != (EPSG *)0x0) {
    psg->voltbl = voltbl[0];
    psg->clk = c;
    uVar1 = 0xac44;
    if (r != 0) {
      uVar1 = r;
    }
    psg->rate = uVar1;
    internal_refresh(psg);
    puVar3 = psg->stereo_mask;
    lVar2 = 0;
    do {
      *puVar3 = '\x03';
      Panning_Centre((INT32 *)((long)psg->pan[0] + lVar2));
      puVar3 = puVar3 + 1;
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x18);
    psg->mask = 0;
  }
  return psg;
}

Assistant:

EPSG *
EPSG_new (UINT32 c, UINT32 r)
{
  EPSG *psg;
  uint8_t i;

  psg = (EPSG *) calloc (1, sizeof (EPSG));
  if (psg == NULL)
    return NULL;

  EPSG_setVolumeMode (psg, EMU2149_VOL_DEFAULT);
  psg->clk = c;
  psg->rate = r ? r : 44100;
  psg->chp_flags = 0x00;
  EPSG_set_quality (psg, 0);

  for (i = 0; i < 3; i++)
  {
    psg->stereo_mask[i] = 0x03;
    Panning_Centre(psg->pan[i]);
  }

  EPSG_setMask(psg, 0x00);

  return psg;
}